

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::
emplace<QTlsPrivate::X509CertificateBase::X509CertificateExtension_const&>
          (QGenericArrayOps<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *this,
          qsizetype i,X509CertificateExtension *args)

{
  X509CertificateExtension **ppXVar1;
  qsizetype *pqVar2;
  undefined2 uVar3;
  Data *pDVar4;
  long lVar5;
  X509CertificateExtension *pXVar6;
  Data *pDVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined1 *puVar14;
  long in_FS_OFFSET;
  bool bVar15;
  X509CertificateExtension tmp;
  Inserter local_d8;
  undefined1 local_88 [72];
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->
           super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0010b958:
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_88._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_88._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88._0_8_ = (args->oid).d.d;
    local_88._8_8_ = (args->oid).d.ptr;
    local_88._16_8_ = (args->oid).d.size;
    if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((QArrayData *)local_88._0_8_)->ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((QArrayData *)local_88._0_8_)->ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_88._24_8_ = (args->name).d.d;
    local_88._32_8_ = (args->name).d.ptr;
    local_88._40_8_ = (args->name).d.size;
    if ((QArrayData *)local_88._24_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((QArrayData *)local_88._24_8_)->ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((QArrayData *)local_88._24_8_)->ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVariant::QVariant((QVariant *)(local_88 + 0x30),&args->value);
    uVar3._0_1_ = args->critical;
    uVar3._1_1_ = args->supported;
    local_38 = (undefined1 *)CONCAT62(local_38._2_6_,uVar3);
    bVar15 = (this->
             super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).
             size != 0;
    QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::detachAndGrow
              (&this->
                super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>,
               (uint)(i == 0 && bVar15),1,(X509CertificateExtension **)0x0,
               (QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension> *)0x0)
    ;
    puVar14 = local_38;
    uVar13 = local_88._40_8_;
    uVar12 = local_88._32_8_;
    uVar11 = local_88._24_8_;
    uVar10 = local_88._16_8_;
    uVar9 = local_88._8_8_;
    uVar8 = local_88._0_8_;
    if (i == 0 && bVar15) {
      pXVar6 = (this->
               super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).
               ptr;
      local_88._0_8_ = (QArrayData *)0x0;
      pXVar6[-1].oid.d.d = (Data *)uVar8;
      local_88._8_8_ = (char16_t *)0x0;
      pXVar6[-1].oid.d.ptr = (char16_t *)uVar9;
      local_88._16_8_ = 0;
      pXVar6[-1].oid.d.size = uVar10;
      local_88._24_8_ = (QArrayData *)0x0;
      pXVar6[-1].name.d.d = (Data *)uVar11;
      local_88._32_8_ = (char16_t *)0x0;
      pXVar6[-1].name.d.ptr = (char16_t *)uVar12;
      local_88._40_8_ = 0;
      pXVar6[-1].name.d.size = uVar13;
      *(undefined8 *)((long)&pXVar6[-1].value.d.data + 0x10) = local_88._64_8_;
      *(undefined1 **)&pXVar6[-1].value.d.field_0x18 = puStack_40;
      pXVar6[-1].value.d.data.shared = (PrivateShared *)local_88._48_8_;
      *(undefined8 *)((long)&pXVar6[-1].value.d.data + 8) = local_88._56_8_;
      local_88._48_8_ = (PrivateShared *)0x0;
      local_88._56_8_ = (undefined1 *)0x0;
      local_88._64_8_ = (undefined1 *)0x0;
      puStack_40 = (undefined1 *)0x2;
      pXVar6[-1].critical = local_38._0_1_;
      pXVar6[-1].supported = local_38._1_1_;
      ppXVar1 = &(this->
                 super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>
                 ).ptr;
      *ppXVar1 = *ppXVar1 + -1;
      pqVar2 = &(this->
                super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>)
                .size;
      *pqVar2 = *pqVar2 + 1;
      local_38 = puVar14;
    }
    else {
      local_d8.sourceCopyConstruct = 0;
      local_d8.nSource = 0;
      local_d8.move = 0;
      local_d8.sourceCopyAssign = 0;
      local_d8.end = (X509CertificateExtension *)0x0;
      local_d8.last = (X509CertificateExtension *)0x0;
      local_d8.where = (X509CertificateExtension *)0x0;
      local_d8.begin =
           (this->
           super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).ptr;
      local_d8.size =
           (this->
           super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).size
      ;
      local_d8.data =
           &this->
            super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>;
      Inserter::insertOne(&local_d8,i,(X509CertificateExtension *)local_88);
      (local_d8.data)->ptr = local_d8.begin;
      (local_d8.data)->size = local_d8.size;
    }
    QVariant::~QVariant((QVariant *)(local_88 + 0x30));
    if ((QArrayData *)local_88._24_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_88._24_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_88._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_88._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_88._24_8_,2,0x10);
      }
    }
    if ((QArrayData *)local_88._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_88._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,2,0x10);
      }
    }
  }
  else {
    lVar5 = (this->
            super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).
            size;
    if ((lVar5 == i && pDVar4 != (Data *)0x0) &&
       ((pDVar4->super_QArrayData).alloc - lVar5 !=
        ((long)((long)(this->
                      super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>
                      ).ptr -
               ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        0x2e8ba2e8ba2e8ba3)) {
      pXVar6 = (this->
               super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).
               ptr;
      pDVar7 = (args->oid).d.d;
      pXVar6[lVar5].oid.d.d = pDVar7;
      pXVar6[lVar5].oid.d.ptr = (args->oid).d.ptr;
      pXVar6[lVar5].oid.d.size = (args->oid).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar7 = (args->name).d.d;
      pXVar6[lVar5].name.d.d = pDVar7;
      pXVar6[lVar5].name.d.ptr = (args->name).d.ptr;
      pXVar6[lVar5].name.d.size = (args->name).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QVariant::QVariant(&pXVar6[lVar5].value,&args->value);
      bVar15 = args->supported;
      pXVar6[lVar5].critical = args->critical;
      pXVar6[lVar5].supported = bVar15;
    }
    else {
      if (((i != 0) || (pDVar4 == (Data *)0x0)) ||
         ((X509CertificateExtension *)
          ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>
          ).ptr)) goto LAB_0010b958;
      pXVar6 = (this->
               super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).
               ptr;
      pDVar7 = (args->oid).d.d;
      pXVar6[-1].oid.d.d = pDVar7;
      pXVar6[-1].oid.d.ptr = (args->oid).d.ptr;
      pXVar6[-1].oid.d.size = (args->oid).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar7 = (args->name).d.d;
      pXVar6[-1].name.d.d = pDVar7;
      pXVar6[-1].name.d.ptr = (args->name).d.ptr;
      pXVar6[-1].name.d.size = (args->name).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QVariant::QVariant(&pXVar6[-1].value,&args->value);
      bVar15 = args->supported;
      pXVar6[-1].critical = args->critical;
      pXVar6[-1].supported = bVar15;
      ppXVar1 = &(this->
                 super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>
                 ).ptr;
      *ppXVar1 = *ppXVar1 + -1;
    }
    pqVar2 = &(this->
              super_QArrayDataPointer<QTlsPrivate::X509CertificateBase::X509CertificateExtension>).
              size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }